

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moldudp64.hh
# Opt level: O0

void __thiscall
helix::nasdaq::moldudp64_session<helix::parity::pmd_handler>::register_callback
          (moldudp64_session<helix::parity::pmd_handler> *this,event_callback *callback)

{
  pmd_handler *this_00;
  long in_RDI;
  event_callback *in_stack_ffffffffffffffa8;
  function<void_(const_helix::event_&)> *in_stack_ffffffffffffffc0;
  function<void_(const_helix::event_&)> local_30;
  
  this_00 = (pmd_handler *)(in_RDI + 0x10);
  std::function<void_(const_helix::event_&)>::function(in_stack_ffffffffffffffc0,&local_30);
  parity::pmd_handler::register_callback(this_00,in_stack_ffffffffffffffa8);
  std::function<void_(const_helix::event_&)>::~function
            ((function<void_(const_helix::event_&)> *)0x148456);
  return;
}

Assistant:

void moldudp64_session<Handler>::register_callback(event_callback callback)
{
    _handler.register_callback(callback);
}